

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O3

Expression * __thiscall
wasm::ConstHoisting::hoist
          (ConstHoisting *this,
          vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *vec)

{
  ulong uVar1;
  pointer pppEVar2;
  Expression **ppEVar3;
  undefined1 auVar4 [16];
  Id index;
  Expression *pEVar5;
  Type in_R8;
  pointer pppEVar6;
  Builder local_40;
  Builder builder;
  
  uVar1 = ((**(vec->super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
              _M_impl.super__Vector_impl_data._M_start)->type).id;
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
       ).super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>.
       super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>.currModule;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  index = Builder::addVar((Builder *)
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
                          ).
                          super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>
                          .
                          super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>
                          .currFunction,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
  builder.wasm = (Module *)
                 Builder::makeLocalSet
                           (&local_40,index,
                            **(vec->
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              )._M_impl.super__Vector_impl_data._M_start);
  pppEVar2 = (vec->super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  for (pppEVar6 = (vec->
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
                  _M_impl.super__Vector_impl_data._M_start; pppEVar6 != pppEVar2;
      pppEVar6 = pppEVar6 + 1) {
    ppEVar3 = *pppEVar6;
    pEVar5 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar5->_id = LocalGetId;
    pEVar5[1]._id = index;
    (pEVar5->type).id = uVar1;
    *ppEVar3 = pEVar5;
  }
  return (Expression *)builder.wasm;
}

Assistant:

Expression* hoist(std::vector<Expression**>& vec) {
    auto type = (*(vec[0]))->type;
    Builder builder(*getModule());
    auto temp = builder.addVar(getFunction(), type);
    auto* ret = builder.makeLocalSet(temp, *(vec[0]));
    for (auto item : vec) {
      *item = builder.makeLocalGet(temp, type);
    }
    return ret;
  }